

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk3c(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  uint offs;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_power_unk3c_entry *peVar6;
  ulong uVar7;
  
  offs = (bios->power).unk3c.offset;
  iVar3 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk3c.version);
    uVar1 = (bios->power).unk3c.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      iVar3 = bios_u8(bios,(bios->power).unk3c.offset + 1,&(bios->power).unk3c.hlen);
      iVar4 = bios_u8(bios,(bios->power).unk3c.offset + 2,&(bios->power).unk3c.rlen);
      iVar5 = bios_u8(bios,(bios->power).unk3c.offset + 3,&(bios->power).unk3c.entriesnum);
      (bios->power).unk3c.valid = iVar5 == 0 && (iVar4 == 0 && iVar3 == 0);
      bVar2 = (bios->power).unk3c.entriesnum;
      peVar6 = (envy_bios_power_unk3c_entry *)malloc((ulong)bVar2 << 2);
      (bios->power).unk3c.entries = peVar6;
      iVar3 = 0;
      for (uVar7 = 0; bVar2 != uVar7; uVar7 = uVar7 + 1) {
        peVar6[uVar7].offset =
             (uint)(bios->power).unk3c.rlen * (int)uVar7 +
             (uint)(bios->power).unk3c.hlen + (bios->power).unk3c.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown POWER TOPOLOGY table version 0x%x\n");
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_power_unk3c(struct envy_bios *bios) {
	struct envy_bios_power_unk3c *unk3c = &bios->power.unk3c;
	int i, err = 0;

	if (!unk3c->offset)
		return -EINVAL;

	bios_u8(bios, unk3c->offset + 0x0, &unk3c->version);
	switch(unk3c->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk3c->offset + 0x1, &unk3c->hlen);
		err |= bios_u8(bios, unk3c->offset + 0x2, &unk3c->rlen);
		err |= bios_u8(bios, unk3c->offset + 0x3, &unk3c->entriesnum);
		unk3c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER TOPOLOGY table version 0x%x\n", unk3c->version);
		return -EINVAL;
	};

	err = 0;
	unk3c->entries = malloc(unk3c->entriesnum * sizeof(struct envy_bios_power_unk3c_entry));
	for (i = 0; i < unk3c->entriesnum; i++) {
		uint32_t data = unk3c->offset + unk3c->hlen + i * unk3c->rlen;

		unk3c->entries[i].offset = data;
	}

	return 0;
}